

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O2

int pcap_set_snaplen(pcap_t *p,int snaplen)

{
  int iVar1;
  
  if (p->activated != 0) {
    builtin_strncpy(p->errbuf,"can\'t perform  operation on activated capture",0x2e);
    return -4;
  }
  iVar1 = 0x40000;
  if (0xfffbffff < snaplen - 0x40001U) {
    iVar1 = snaplen;
  }
  p->snapshot = iVar1;
  return 0;
}

Assistant:

int
pcap_set_snaplen(pcap_t *p, int snaplen)
{
	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);

	/*
	 * Turn invalid values, or excessively large values, into
	 * the maximum allowed value.
	 *
	 * If some application really *needs* a bigger snapshot
	 * length, we should just increase MAXIMUM_SNAPLEN.
	 */
	if (snaplen <= 0 || snaplen > MAXIMUM_SNAPLEN)
		snaplen = MAXIMUM_SNAPLEN;
	p->snapshot = snaplen;
	return (0);
}